

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void __thiscall
CPP::WriteInitialization::addStringInitializer
          (WriteInitialization *this,Item *item,DomPropertyMap *properties,QString *name,int column,
          QString *directive)

{
  DomString *element;
  QArrayData *pQVar1;
  long lVar2;
  bool translatable;
  Node<QString,_DomProperty_*> *pNVar3;
  long in_FS_OFFSET;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((properties->d != (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) &&
       (pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::findNode<QString>
                           (properties->d,name), pNVar3 != (Node<QString,_DomProperty_*> *)0x0)) &&
      (pNVar3->value != (DomProperty *)0x0)) &&
     (element = pNVar3->value->m_string, element != (DomString *)0x0)) {
    pQVar1 = &((element->m_text).d.d)->super_QArrayData;
    lVar2 = (element->m_text).d.size;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar2 != 0) {
      translatable = needsTranslation<DomString>(element);
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      autoTrCall(&local_58,this,element,&local_78);
      addInitializer(item,name,column,&local_58,directive,translatable);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::addStringInitializer(Item *item,
        const DomPropertyMap &properties, const QString &name, int column, const QString &directive) const
{
    if (const DomProperty *p = properties.value(name)) {
        DomString *str = p->elementString();
        QString text = toString(str);
        if (!text.isEmpty()) {
            bool translatable = needsTranslation(str);
            QString value = autoTrCall(str);
            addInitializer(item, name, column, value, directive, translatable);
        }
    }
}